

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteFoldedExprList(WatWriter *this,ExprList *exprs)

{
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *this_00;
  undefined8 *puVar1;
  undefined4 *puVar2;
  pointer pEVar3;
  undefined8 uVar4;
  bool bVar5;
  reference expr;
  long lVar6;
  pointer pEVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  pointer pEVar12;
  const_iterator rhs;
  Arities AVar13;
  ExprTree tree;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  local_58;
  const_iterator __begin2;
  
  __begin2.node_ = exprs->first_;
  this_00 = &this->expr_tree_stack_;
  __begin2.list_ = exprs;
  do {
    rhs.node_ = (Expr *)0x0;
    rhs.list_ = exprs;
    bVar5 = intrusive_list<wabt::Expr>::const_iterator::operator!=(&__begin2,rhs);
    if (!bVar5) {
      return;
    }
    expr = intrusive_list<wabt::Expr>::const_iterator::operator*(&__begin2);
    AVar13 = ModuleContext::GetExprArity(&this->super_ModuleContext,expr);
    uVar10 = AVar13.nargs;
    pEVar3 = (this->expr_tree_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (uVar10 == 0) {
      pEVar12 = pEVar3;
      uVar9 = 0;
    }
    else {
      uVar8 = 0;
      pEVar7 = pEVar3;
      while (pEVar12 = pEVar3, uVar9 = uVar8,
            pEVar7 != (this_00->
                      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      )._M_impl.super__Vector_impl_data._M_start) {
        if (pEVar7[-1].result_count == 0) {
          __assert_fail("iter->result_count > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wat-writer.cc"
                        ,0x473,
                        "void wabt::(anonymous namespace)::WatWriter::PushExpr(const Expr *, Index, Index)"
                       );
        }
        uVar8 = uVar8 + pEVar7[-1].result_count;
        pEVar7 = pEVar7 + -1;
        pEVar12 = pEVar7;
        uVar9 = uVar10;
        if ((uVar8 == uVar10) || (pEVar12 = pEVar3, uVar9 = uVar8, uVar10 < uVar8)) break;
      }
    }
    tree.children.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tree.children.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tree.children.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tree.result_count = AVar13.nreturns;
    tree.expr = expr;
    if ((uVar10 != 0) && (uVar9 == uVar10)) {
      pEVar7 = pEVar12;
      for (lVar6 = ((long)pEVar3 - (long)pEVar12) / 0x28; 0 < lVar6; lVar6 = lVar6 + -1) {
        std::
        vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ::emplace_back<wabt::(anonymous_namespace)::ExprTree>(&tree.children,pEVar7);
        pEVar7 = pEVar7 + 1;
      }
      if (pEVar12 != pEVar3) {
        lVar6 = (long)(this->expr_tree_stack_).
                      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3;
        pEVar7 = pEVar3;
        if (lVar6 != 0) {
          lVar11 = 0;
          for (lVar6 = lVar6 / 0x28; 0 < lVar6; lVar6 = lVar6 + -1) {
            puVar1 = (undefined8 *)((long)&pEVar3->expr + lVar11);
            puVar2 = (undefined4 *)((long)&pEVar12->result_count + lVar11);
            local_58.
            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(puVar2 + -2);
            uVar4 = puVar1[1];
            local_58.
            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
            ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(puVar2 + -6);
            local_58.
            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
            ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(puVar2 + -4);
            *(undefined8 *)(puVar2 + -8) = *puVar1;
            *(undefined8 *)(puVar2 + -6) = uVar4;
            uVar4 = puVar1[3];
            *(undefined8 *)(puVar2 + -4) = puVar1[2];
            *(undefined8 *)(puVar2 + -2) = uVar4;
            puVar1[1] = 0;
            puVar1[2] = 0;
            puVar1[3] = 0;
            std::
            vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
            ::~vector(&local_58);
            *puVar2 = *(undefined4 *)(puVar1 + 4);
            lVar11 = lVar11 + 0x28;
          }
          pEVar7 = (this->expr_tree_stack_).
                   super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        std::
        vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ::_M_erase_at_end(this_00,(pointer)((long)pEVar12 + ((long)pEVar7 - (long)pEVar3)));
      }
    }
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::emplace_back<wabt::(anonymous_namespace)::ExprTree>(this_00,&tree);
    if ((AVar13._0_8_ >> 0x20 == 0) || (uVar10 < uVar9)) {
      FlushExprTreeStack(this);
    }
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::~vector(&tree.children);
    intrusive_list<wabt::Expr>::const_iterator::operator++(&__begin2);
  } while( true );
}

Assistant:

void WatWriter::WriteFoldedExprList(const ExprList& exprs) {
  WABT_TRACE(WriteFoldedExprList);
  for (const Expr& expr : exprs) {
    WriteFoldedExpr(&expr);
  }
}